

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cc
# Opt level: O0

Builder * __thiscall
sentencepiece::normalizer::Builder::BuildNFKCMap(Builder *this,CharsMap *chars_map)

{
  basic_string_view<char,_std::char_traits<char>_> __str;
  int iVar1;
  char *pcVar2;
  ostream *poVar3;
  basic_ostream<char,_std::char_traits<char>_> *pbVar4;
  Die local_19;
  CharsMap *local_18;
  CharsMap *chars_map_local;
  
  local_18 = chars_map;
  chars_map_local = (CharsMap *)this;
  iVar1 = sentencepiece::logging::GetMinLogLevel();
  if (iVar1 < 3) {
    error::Die::Die(&local_19,false);
    pcVar2 = logging::BaseName("src/builder.cc");
    poVar3 = std::operator<<((ostream *)&std::cerr,pcVar2);
    poVar3 = std::operator<<(poVar3,"(");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x167);
    poVar3 = std::operator<<(poVar3,") ");
    poVar3 = std::operator<<(poVar3,"LOG(");
    poVar3 = std::operator<<(poVar3,"ERROR");
    poVar3 = std::operator<<(poVar3,") ");
    __str._M_str = (char *)0x3a6dec;
    __str._M_len = 0x45;
    pbVar4 = std::operator<<(poVar3,__str);
    error::Die::operator&(&local_19,pbVar4);
    error::Die::~Die(&local_19);
  }
  util::OkStatus();
  return this;
}

Assistant:

util::Status Builder::BuildNFKCMap(CharsMap *chars_map) {
#ifdef ENABLE_NFKC_COMPILE
  LOG(INFO) << "Running BuildNFKCMap";
  BuildMapInternal(chars_map, ToNFKC, ToNFKD);
#else
  LOG(ERROR) << kCompileError;
#endif

  return util::OkStatus();
}